

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_range_benchmark.c
# Opt level: O3

int main(void)

{
  long lVar1;
  testvalue_t tv;
  int iVar2;
  int iVar3;
  _Bool _Var4;
  ulong uVar5;
  ulong uVar6;
  roaring_bitmap_t *prVar7;
  roaring_bitmap_t *prVar8;
  byte bVar9;
  uint32_t step;
  roaring_bitmap_t *bm;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  void *pvVar13;
  uint uVar14;
  int i;
  int iVar15;
  long lVar16;
  timespec ts;
  timespec ts_4;
  timespec local_68;
  undefined8 uStack_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  timespec local_40;
  
  lVar16 = 0;
  do {
    uVar14 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
    bVar9 = (byte)(pcg32_global_0 >> 0x3b);
    uVar14 = uVar14 >> bVar9 | uVar14 << 0x20 - bVar9;
    while( true ) {
      pcg32_global_0 = pcg32_global_0 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      bVar9 = (byte)(pcg32_global_0 >> 0x38);
      uVar10 = (uint)(pcg32_global_0 >> 0x20);
      if (uVar14 < 0xfffffffe) break;
      uVar14 = uVar10 >> 0xd ^ (uint)(pcg32_global_0 >> 0x1b);
      bVar9 = bVar9 >> 3;
      uVar14 = uVar14 >> bVar9 | uVar14 << 0x20 - bVar9;
    }
    uVar5 = pcg32_global_0 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    uVar10 = uVar10 >> 0xd ^ (uint)(pcg32_global_0 >> 0x1b);
    bVar9 = bVar9 >> 3;
    uVar12 = uVar10 >> bVar9 | uVar10 << 0x20 - bVar9;
    if (uVar10 == 0xffffffff) {
      do {
        uVar6 = uVar5;
        uVar5 = uVar6 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
        uVar10 = (uint)(uVar6 >> 0x2d) ^ (uint)(uVar6 >> 0x1b);
      } while (uVar10 == 0xffffffff);
      bVar9 = (byte)(uVar6 >> 0x3b);
      uVar12 = uVar10 >> bVar9 | uVar10 << 0x20 - bVar9;
    }
    uVar10 = (uint)(uVar5 >> 0x2d) ^ (uint)(uVar5 >> 0x1b);
    bVar9 = (byte)(uVar5 >> 0x3b);
    lVar1 = (ulong)(uVar10 >> bVar9 | uVar10 << 0x20 - bVar9) * 0xffff;
    iVar15 = (int)lVar1;
    pcg32_global_0 = uVar5;
    while (pcg32_global_0 = pcg32_global_0 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb, iVar15 == 0) {
      uVar10 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
      bVar9 = (byte)(pcg32_global_0 >> 0x3b);
      lVar1 = (ulong)(uVar10 >> bVar9 | uVar10 << 0x20 - bVar9) * 0xffff;
      iVar15 = (int)lVar1;
    }
    uVar10 = uVar12;
    if (uVar14 >= uVar12 && uVar14 != uVar12) {
      uVar10 = uVar14;
    }
    uVar11 = uVar12;
    if (uVar14 < uVar12) {
      uVar11 = uVar14;
    }
    uVar10 = (uVar14 == uVar12) + uVar10;
    (&DAT_0012e0f8)[lVar16 * 8] = uVar11;
    (&DAT_0012e0fc)[lVar16 * 8] = uVar10;
    step = (uint32_t)((ulong)lVar1 >> 0x20);
    (&DAT_0012e100)[lVar16 * 8] = step;
    prVar7 = roaring_bitmap_from_range((ulong)uVar11,(ulong)uVar10,step);
    (&run_test_testvalues)[lVar16 * 4] = prVar7;
    uVar14 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
    bVar9 = (byte)(pcg32_global_0 >> 0x3b);
    uVar14 = uVar14 >> bVar9 | uVar14 << 0x20 - bVar9;
    uVar5 = pcg32_global_0;
    while( true ) {
      uVar5 = uVar5 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      bVar9 = (byte)(uVar5 >> 0x38);
      uVar10 = (uint)(uVar5 >> 0x20);
      if (uVar14 < 0xfffffffe) break;
      uVar14 = uVar10 >> 0xd ^ (uint)(uVar5 >> 0x1b);
      bVar9 = bVar9 >> 3;
      uVar14 = uVar14 >> bVar9 | uVar14 << 0x20 - bVar9;
    }
    pcg32_global_0 = uVar5 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    uVar10 = uVar10 >> 0xd ^ (uint)(uVar5 >> 0x1b);
    bVar9 = bVar9 >> 3;
    uVar12 = uVar10 >> bVar9 | uVar10 << 0x20 - bVar9;
    if (uVar10 == 0xffffffff) {
      do {
        uVar5 = pcg32_global_0;
        pcg32_global_0 = uVar5 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
        uVar10 = (uint)(uVar5 >> 0x2d) ^ (uint)(uVar5 >> 0x1b);
      } while (uVar10 == 0xffffffff);
      bVar9 = (byte)(uVar5 >> 0x3b);
      uVar12 = uVar10 >> bVar9 | uVar10 << 0x20 - bVar9;
    }
    uVar10 = uVar12;
    if (uVar14 < uVar12) {
      uVar10 = uVar14;
    }
    uVar11 = uVar12;
    if (uVar12 < uVar14) {
      uVar11 = uVar14;
    }
    uVar11 = (uVar14 == uVar12) + uVar11;
    (&DAT_0012e104)[lVar16 * 8] = uVar10;
    (&DAT_0012e108)[lVar16 * 8] = uVar11;
    prVar8 = roaring_bitmap_from_range((ulong)uVar10,(ulong)uVar11,1);
    _Var4 = roaring_bitmap_intersect(prVar7,prVar8);
    roaring_bitmap_free(prVar8);
    (&DAT_0012e10c)[lVar16 * 0x20] = _Var4;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 100);
  puts("  roaring_bitmap_from_range():");
  iVar15 = 0;
  printf("%s %s: ","naive_intersect","pre");
  fflush((FILE *)0x0);
  lVar16 = 0x18;
  do {
    clock_gettime(3,&local_68);
    iVar2 = (int)local_68.tv_sec;
    iVar3 = (int)local_68.tv_nsec;
    prVar7 = *(roaring_bitmap_t **)((long)&croaring_detect_supported_architectures::buffer + lVar16)
    ;
    prVar8 = roaring_bitmap_from_range
                       ((ulong)*(uint *)(lVar16 + 0x12e0ec),
                        (ulong)*(uint *)((long)&run_test_testvalues + lVar16),1);
    roaring_bitmap_intersect(prVar7,prVar8);
    roaring_bitmap_free(prVar8);
    clock_gettime(3,&local_68);
    iVar15 = ((int)local_68.tv_sec - iVar2) * 1000000000 + ((int)local_68.tv_nsec - iVar3) + iVar15;
    lVar16 = lVar16 + 0x20;
  } while (lVar16 != 0xc98);
  printf(" %.2f cycles per operation",SUB84((double)((float)iVar15 / 100.0),0));
  putchar(10);
  lVar16 = 0;
  fflush((FILE *)0x0);
  puts("  roaring_bitmap_intersect_with_range():");
  printf("%s %s: ","range_intersect","pre");
  fflush((FILE *)0x0);
  iVar15 = 0;
  do {
    pvVar13 = (void *)0x3;
    clock_gettime(3,&local_68);
    iVar2 = (int)local_68.tv_sec;
    iVar3 = (int)local_68.tv_nsec;
    range_intersect(pvVar13,*(testvalue_t *)((long)&run_test_testvalues + lVar16));
    clock_gettime(3,&local_68);
    iVar15 = ((int)local_68.tv_sec - iVar2) * 1000000000 + ((int)local_68.tv_nsec - iVar3) + iVar15;
    lVar16 = lVar16 + 0x20;
  } while (lVar16 != 0xc80);
  printf(" %.2f cycles per operation",SUB84((double)((float)iVar15 / 100.0),0));
  putchar(10);
  lVar16 = 0;
  fflush((FILE *)0x0);
  do {
    roaring_bitmap_free(*(roaring_bitmap_t **)((long)&run_test_testvalues + lVar16));
    lVar16 = lVar16 + 0x20;
  } while (lVar16 != 0xc80);
  prVar7 = roaring_bitmap_from_range(0,0xfffffffe,2);
  local_68.tv_nsec = -0x200000000;
  uStack_58 = 0xfffffffd00000002;
  uStack_50 = 0xffffffff;
  local_68.tv_sec = (__time_t)prVar7;
  prVar8 = roaring_bitmap_from_range(0xfffffffd,0xffffffff,1);
  _Var4 = roaring_bitmap_intersect(prVar7,prVar8);
  roaring_bitmap_free(prVar8);
  uStack_4c = CONCAT31(uStack_4c._1_3_,_Var4);
  puts("  roaring_bitmap_from_range():");
  printf("%s %s: ","naive_intersect","pre");
  fflush((FILE *)0x0);
  clock_gettime(3,&local_40);
  iVar2 = (int)local_40.tv_nsec;
  iVar15 = (int)local_40.tv_sec;
  prVar8 = roaring_bitmap_from_range(0xfffffffd,0xffffffff,1);
  roaring_bitmap_intersect(prVar7,prVar8);
  roaring_bitmap_free(prVar8);
  clock_gettime(3,&local_40);
  printf(" %.2f cycles per operation",
         SUB84((double)(((int)local_40.tv_sec - iVar15) * 1000000000 +
                       ((int)local_40.tv_nsec - iVar2)),0));
  putchar(10);
  fflush((FILE *)0x0);
  puts("  roaring_bitmap_intersect_with_range():");
  printf("%s %s: ","range_intersect","pre");
  fflush((FILE *)0x0);
  pvVar13 = (void *)0x3;
  clock_gettime(3,&local_40);
  iVar2 = (int)local_40.tv_nsec;
  iVar15 = (int)local_40.tv_sec;
  tv._28_4_ = uStack_4c;
  tv.range[1] = uStack_50;
  tv.bitmap_range[0] = (int)local_68.tv_nsec;
  tv.bitmap_range[1] = local_68.tv_nsec._4_4_;
  tv.bitmap = (roaring_bitmap_t *)local_68.tv_sec;
  tv.bitmap_range[2] = (undefined4)uStack_58;
  tv.range[0] = uStack_58._4_4_;
  range_intersect(pvVar13,tv);
  clock_gettime(3,&local_40);
  printf(" %.2f cycles per operation",
         SUB84((double)(((int)local_40.tv_sec - iVar15) * 1000000000 +
                       ((int)local_40.tv_nsec - iVar2)),0));
  putchar(10);
  fflush((FILE *)0x0);
  roaring_bitmap_free(prVar7);
  return 0;
}

Assistant:

int main(void) {
    run_test();
    return 0;
}